

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_fprintdot(FILE *out,MTBDD mtbdd)

{
  int iVar1;
  MTBDD MVar2;
  char *pcVar3;
  MTBDD mtbdd_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"digraph \"DD\" {\n");
  fprintf((FILE *)out,"graph [dpi = 300];\n");
  fprintf((FILE *)out,"center = true;\n");
  fprintf((FILE *)out,"edge [dir = forward];\n");
  fprintf((FILE *)out,"root [style=invis];\n");
  MVar2 = MTBDD_STRIPMARK(mtbdd);
  iVar1 = MTBDD_HASMARK(mtbdd);
  pcVar3 = "none";
  if (iVar1 != 0) {
    pcVar3 = "dot";
  }
  fprintf((FILE *)out,"root -> %lu [style=solid dir=both arrowtail=%s];\n",MVar2,pcVar3);
  mtbdd_fprintdot_rec(out,mtbdd);
  mtbdd_unmark_rec(mtbdd);
  fprintf((FILE *)out,"}\n");
  return;
}

Assistant:

void
mtbdd_fprintdot(FILE *out, MTBDD mtbdd)
{
    fprintf(out, "digraph \"DD\" {\n");
    fprintf(out, "graph [dpi = 300];\n");
    fprintf(out, "center = true;\n");
    fprintf(out, "edge [dir = forward];\n");
    fprintf(out, "root [style=invis];\n");
    fprintf(out, "root -> %" PRIu64 " [style=solid dir=both arrowtail=%s];\n",
            MTBDD_STRIPMARK(mtbdd), MTBDD_HASMARK(mtbdd) ? "dot" : "none");

    mtbdd_fprintdot_rec(out, mtbdd);
    mtbdd_unmark_rec(mtbdd);

    fprintf(out, "}\n");
}